

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

MeshPointOrigin * iDynTree::optimalcontrol::MeshPointOrigin::CompensateLongPeriod(void)

{
  MeshPointOrigin *in_RDI;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CompensateLongPeriod",&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"A mesh filling a long period",&local_4a);
  MeshPointOrigin(in_RDI,&local_28,6,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

static MeshPointOrigin CompensateLongPeriod() {return MeshPointOrigin("CompensateLongPeriod", 6, "A mesh filling a long period");}